

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiDockNodeSettings * ImGui::DockSettingsFindNodeSettings(ImGuiContext *ctx,ImGuiID id)

{
  ImGuiDockNodeSettings *pIVar1;
  int local_2c;
  int n;
  ImGuiDockContext *dc;
  ImGuiID id_local;
  ImGuiContext *ctx_local;
  
  local_2c = 0;
  while( true ) {
    if ((ctx->DockContext).NodesSettings.Size <= local_2c) {
      return (ImGuiDockNodeSettings *)0x0;
    }
    pIVar1 = ImVector<ImGuiDockNodeSettings>::operator[](&(ctx->DockContext).NodesSettings,local_2c)
    ;
    if (pIVar1->ID == id) break;
    local_2c = local_2c + 1;
  }
  pIVar1 = ImVector<ImGuiDockNodeSettings>::operator[](&(ctx->DockContext).NodesSettings,local_2c);
  return pIVar1;
}

Assistant:

static ImGuiDockNodeSettings* ImGui::DockSettingsFindNodeSettings(ImGuiContext* ctx, ImGuiID id)
{
    // FIXME-OPT
    ImGuiDockContext* dc  = &ctx->DockContext;
    for (int n = 0; n < dc->NodesSettings.Size; n++)
        if (dc->NodesSettings[n].ID == id)
            return &dc->NodesSettings[n];
    return NULL;
}